

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

Array<asl::Var> * __thiscall asl::Array<asl::Var>::insert(Array<asl::Var> *this,int k,Var *x)

{
  Var *pVVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  Var *pVVar5;
  anon_union_8_8_7df20137_for_Var_3 aVar6;
  undefined4 uVar7;
  Var *pVVar8;
  undefined8 *puVar9;
  Var *extraout_RDX;
  Var *src;
  Var *extraout_RDX_00;
  Type TVar10;
  int iVar11;
  
  pVVar8 = this->_a;
  TVar2 = pVVar8[-1]._type;
  iVar3 = *(int *)&pVVar8[-1].field_0x4;
  TVar10 = k;
  if (k < 0) {
    TVar10 = TVar2;
  }
  if ((int)TVar2 < iVar3) {
    pVVar8 = pVVar8 + -1;
    src = x;
LAB_0012dbd5:
    if (TVar2 - TVar10 != 0 && (int)TVar10 <= (int)TVar2) {
      memmove(this->_a + (long)(int)TVar10 + 1,this->_a + (int)TVar10,
              (long)(int)(TVar2 - TVar10) << 4);
      src = extraout_RDX_00;
    }
    pVVar5 = this->_a;
    uVar7 = *(undefined4 *)&x->field_0x4;
    aVar6 = x->field_1;
    pVVar1 = pVVar5 + (int)TVar10;
    pVVar1->_type = x->_type;
    *(undefined4 *)&pVVar1->field_0x4 = uVar7;
    pVVar1->field_1 = aVar6;
    if ((pVVar5[(int)TVar10]._type & STRING) != NONE) {
      Var::copy(pVVar5 + (int)TVar10,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)src);
    }
    pVVar8->_type = TVar2 + NUL;
    return this;
  }
  if (TVar2 != 0x7fffffff) {
    dup(this,k);
    iVar4 = this->_a[-1].field_1._i;
    iVar11 = 0x7fffffff;
    if (iVar3 < 0x3ffffffe) {
      iVar11 = iVar3 * 2 + 2;
    }
    pVVar8 = (Var *)realloc(this->_a + -1,(long)iVar11 * 0x10 + 0x10);
    if (pVVar8 != (Var *)0x0) {
      this->_a = pVVar8 + 1;
      *(int *)&pVVar8->field_0x4 = iVar11;
      (pVVar8->field_1)._i = iVar4;
      src = extraout_RDX;
      goto LAB_0012dbd5;
    }
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = dup2;
  __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}